

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O3

void Aig_ManMarkValidChoices(Aig_Man_t *p)

{
  Aig_Obj_t *pNew;
  Aig_Obj_t *pOld;
  int iVar1;
  Aig_Obj_t **ppAVar2;
  long lVar3;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  
  if (p->pReprs == (Aig_Obj_t **)0x0) {
    __assert_fail("p->pReprs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRepr.c"
                  ,0x1e5,"void Aig_ManMarkValidChoices(Aig_Man_t *)");
  }
  if (p->pEquivs != (Aig_Obj_t **)0x0) {
    __assert_fail("p->pEquivs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRepr.c"
                  ,0x1e7,"void Aig_ManMarkValidChoices(Aig_Man_t *)");
  }
  pVVar5 = p->vObjs;
  iVar1 = pVVar5->nSize;
  ppAVar2 = (Aig_Obj_t **)calloc(1,(long)iVar1 * 8);
  p->pEquivs = ppAVar2;
  if (0 < (long)iVar1) {
    lVar4 = 0;
    do {
      pNew = (Aig_Obj_t *)pVVar5->pArray[lVar4];
      if ((pNew != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pNew->field_0x18 & 7) - 7)) {
        ppAVar2 = p->pReprs;
        if (ppAVar2 == (Aig_Obj_t **)0x0) {
          __assert_fail("p->pReprs != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRepr.c"
                        ,0x85,"Aig_Obj_t *Aig_ObjFindRepr(Aig_Man_t *, Aig_Obj_t *)");
        }
        if (((ulong)pNew & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRepr.c"
                        ,0x86,"Aig_Obj_t *Aig_ObjFindRepr(Aig_Man_t *, Aig_Obj_t *)");
        }
        lVar3 = (long)pNew->Id;
        if (p->nReprsAlloc <= pNew->Id) {
          __assert_fail("pNode->Id < p->nReprsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRepr.c"
                        ,0x87,"Aig_Obj_t *Aig_ObjFindRepr(Aig_Man_t *, Aig_Obj_t *)");
        }
        pOld = ppAVar2[lVar3];
        if (pOld != (Aig_Obj_t *)0x0) {
          if (0xfffffffd < (*(uint *)&pOld->field_0x18 & 7) - 7) {
            iVar1 = Aig_ObjCheckTfi(p,pNew,pOld);
            if ((iVar1 == 0) && ((*(uint *)&pNew->field_0x18 & 0xffffffc0) == 0)) {
              iVar1 = pOld->Id;
              p->pEquivs[pNew->Id] = p->pEquivs[iVar1];
              p->pEquivs[iVar1] = pNew;
              goto LAB_006cd74d;
            }
            ppAVar2 = p->pReprs;
            if (ppAVar2 == (Aig_Obj_t **)0x0) {
              __assert_fail("p->pReprs != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRepr.c"
                            ,0x99,"void Aig_ObjClearRepr(Aig_Man_t *, Aig_Obj_t *)");
            }
            lVar3 = (long)pNew->Id;
            if (p->nReprsAlloc <= pNew->Id) {
              __assert_fail("pNode->Id < p->nReprsAlloc",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRepr.c"
                            ,0x9b,"void Aig_ObjClearRepr(Aig_Man_t *, Aig_Obj_t *)");
            }
          }
          ppAVar2[lVar3] = (Aig_Obj_t *)0x0;
        }
      }
LAB_006cd74d:
      lVar4 = lVar4 + 1;
      pVVar5 = p->vObjs;
    } while (lVar4 < pVVar5->nSize);
  }
  return;
}

Assistant:

void Aig_ManMarkValidChoices( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pRepr;
    int i;
    assert( p->pReprs != NULL );
    // create equivalent nodes in the manager
    assert( p->pEquivs == NULL );
    p->pEquivs = ABC_ALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p) );
    memset( p->pEquivs, 0, sizeof(Aig_Obj_t *) * Aig_ManObjNumMax(p) );
    // make the choice nodes
    Aig_ManForEachNode( p, pObj, i )
    {
        pRepr = Aig_ObjFindRepr( p, pObj );
        if ( pRepr == NULL )
            continue;
        // skip constant and PI classes
        if ( !Aig_ObjIsNode(pRepr) )
        {
            Aig_ObjClearRepr( p, pObj );
            continue;
        }
        // skip choices with combinatinal loops
        if ( Aig_ObjCheckTfi( p, pObj, pRepr ) )
        {
            Aig_ObjClearRepr( p, pObj );
            continue;
        }
//printf( "Node %d is represented by node %d.\n", pObj->Id, pRepr->Id );
        // add choice to the choice node
        if ( pObj->nRefs > 0 )
        {
            Aig_ObjClearRepr( p, pObj );
            continue;
        }
        assert( pObj->nRefs == 0 );
        p->pEquivs[pObj->Id] = p->pEquivs[pRepr->Id];
        p->pEquivs[pRepr->Id] = pObj;
    }
}